

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall
UtestShell::runOneTestInCurrentProcess(UtestShell *this,TestPlugin *plugin,TestResult *result)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  OutsideTestRunnerUTest *pOVar4;
  TestResult *pTVar2;
  undefined4 extraout_var_00;
  
  (*result->_vptr_TestResult[0xf])(result,"\n-- before runAllPreTestAction: ");
  (*plugin->_vptr_TestPlugin[5])(plugin,this,result);
  (*result->_vptr_TestResult[0xf])(result,"\n-- after runAllPreTestAction: ");
  pOVar4 = (OutsideTestRunnerUTest *)currentTest_;
  if (currentTest_ == (UtestShell *)0x0) {
    OutsideTestRunnerUTest::instance();
    pOVar4 = &OutsideTestRunnerUTest::instance::instance_;
  }
  pTVar2 = testResult_;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar1 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x29])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar2 = (TestResult *)CONCAT44(extraout_var,iVar1);
  }
  testResult_ = result;
  currentTest_ = this;
  (*result->_vptr_TestResult[0xf])(result,"\n---- before createTest: ");
  iVar1 = (*this->_vptr_UtestShell[0x22])(this);
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar1);
  (*result->_vptr_TestResult[0xf])(result,"\n---- after createTest: ");
  (*result->_vptr_TestResult[0xf])(result,"\n------ before runTest: ");
  (**(code **)(*plVar3 + 0x10))(plVar3);
  (*result->_vptr_TestResult[0xf])(result,"\n------ after runTest: ");
  testResult_ = pTVar2;
  currentTest_ = &pOVar4->super_UtestShell;
  (*result->_vptr_TestResult[0xf])(result,"\n---- before destroyTest: ");
  (*this->_vptr_UtestShell[0x23])(this,plVar3);
  (*result->_vptr_TestResult[0xf])(result,"\n---- after destroyTest: ");
  (*result->_vptr_TestResult[0xf])(result,"\n-- before runAllPostTestAction: ");
  (*plugin->_vptr_TestPlugin[6])(plugin,this,result);
  (*result->_vptr_TestResult[0xf])(result,"\n-- after runAllPostTestAction: ");
  return;
}

Assistant:

void UtestShell::runOneTestInCurrentProcess(TestPlugin* plugin, TestResult& result)
{
    result.printVeryVerbose("\n-- before runAllPreTestAction: ");
    plugin->runAllPreTestAction(*this, result);
    result.printVeryVerbose("\n-- after runAllPreTestAction: ");

    //save test context, so that test class can be tested
    UtestShell* savedTest = UtestShell::getCurrent();
    TestResult* savedResult = UtestShell::getTestResult();

    UtestShell::setTestResult(&result);
    UtestShell::setCurrentTest(this);

    result.printVeryVerbose("\n---- before createTest: ");
    Utest* testToRun = createTest();
    result.printVeryVerbose("\n---- after createTest: ");

    result.printVeryVerbose("\n------ before runTest: ");
    testToRun->run();
    result.printVeryVerbose("\n------ after runTest: ");

    UtestShell::setCurrentTest(savedTest);
    UtestShell::setTestResult(savedResult);

    result.printVeryVerbose("\n---- before destroyTest: ");
    destroyTest(testToRun);
    result.printVeryVerbose("\n---- after destroyTest: ");

    result.printVeryVerbose("\n-- before runAllPostTestAction: ");
    plugin->runAllPostTestAction(*this, result);
    result.printVeryVerbose("\n-- after runAllPostTestAction: ");
}